

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O1

ERR_SAVE_STATE * ERR_save_state(void)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ERR_STATE *pEVar4;
  ERR_SAVE_STATE *__ptr;
  err_error_st *dst;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  pEVar4 = err_get_state();
  if (pEVar4 != (ERR_STATE *)0x0) {
    uVar2 = pEVar4->top;
    uVar3 = pEVar4->bottom;
    if ((uVar2 != uVar3) && (__ptr = (ERR_SAVE_STATE *)malloc(0x10), __ptr != (ERR_SAVE_STATE *)0x0)
       ) {
      uVar5 = uVar2 + 0x10;
      if (uVar3 <= uVar2) {
        uVar5 = uVar2;
      }
      uVar6 = (ulong)(uVar5 - uVar3);
      if (0xf < uVar5 - uVar3) {
        __assert_fail("num_errors < ERR_NUM_ERRORS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                      ,0x303,"ERR_SAVE_STATE *ERR_save_state()");
      }
      dst = (err_error_st *)malloc(uVar6 * 0x18);
      __ptr->errors = dst;
      if (dst != (err_error_st *)0x0) {
        if (uVar5 != uVar3) {
          memset(dst,0,uVar6 * 0x18);
        }
        __ptr->num_errors = uVar6;
        if (uVar5 == uVar3) {
          return __ptr;
        }
        lVar7 = 1;
        do {
          err_copy(dst,pEVar4->errors + (pEVar4->bottom + (int)lVar7 & 0xf));
          lVar1 = (-(ulong)(uVar6 == 0) - uVar6) + lVar7;
          lVar7 = lVar7 + 1;
          dst = dst + 1;
        } while (lVar1 != 0);
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (ERR_SAVE_STATE *)0x0;
}

Assistant:

ERR_SAVE_STATE *ERR_save_state(void) {
  ERR_STATE *const state = err_get_state();
  if (state == NULL || state->top == state->bottom) {
    return NULL;
  }

  ERR_SAVE_STATE *ret =
      reinterpret_cast<ERR_SAVE_STATE *>(malloc(sizeof(ERR_SAVE_STATE)));
  if (ret == NULL) {
    return NULL;
  }

  // Errors are stored in the range (bottom, top].
  size_t num_errors = state->top >= state->bottom
                          ? state->top - state->bottom
                          : ERR_NUM_ERRORS + state->top - state->bottom;
  assert(num_errors < ERR_NUM_ERRORS);
  ret->errors = reinterpret_cast<err_error_st *>(
      malloc(num_errors * sizeof(struct err_error_st)));
  if (ret->errors == NULL) {
    free(ret);
    return NULL;
  }
  OPENSSL_memset(ret->errors, 0, num_errors * sizeof(struct err_error_st));
  ret->num_errors = num_errors;

  for (size_t i = 0; i < num_errors; i++) {
    size_t j = (state->bottom + i + 1) % ERR_NUM_ERRORS;
    err_copy(&ret->errors[i], &state->errors[j]);
  }
  return ret;
}